

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall
QMdiAreaPrivate::emitWindowActivated(QMdiAreaPrivate *this,QMdiSubWindow *activeWindow)

{
  long lVar1;
  QWidget *this_00;
  long lVar2;
  Data *pDVar3;
  long lVar4;
  QWidget *pQVar5;
  bool bVar6;
  int iVar7;
  QObject *pQVar8;
  qsizetype qVar9;
  Data *pDVar10;
  long in_RCX;
  long lVar11;
  int index;
  long in_FS_OFFSET;
  QWidget *local_58;
  QObject *local_50;
  void *local_48;
  QObject **ppQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pDVar10 = (this->active).wp.d;
  if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = (this->active).wp.value;
  }
  local_58 = &activeWindow->super_QWidget;
  if (pQVar8 == (QObject *)activeWindow) goto LAB_0044784f;
  pDVar10 = (this->aboutToBecomeActive).wp.d;
  if (((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) ||
     ((this->aboutToBecomeActive).wp.value == (QObject *)0x0)) {
    _q_deactivateAllWindows(this,activeWindow);
  }
  if (this->showActiveWindowMaximized == true) {
    bVar6 = QWidget::isMaximized(local_58);
    if (!bVar6) {
      QWidget::showMaximized(local_58);
    }
    this->showActiveWindowMaximized = false;
  }
  qVar9 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                    (&this->childWindows,(QMdiSubWindow **)&local_58,0);
  lVar2 = (this->indicesToActivatedChildren).d.size;
  index = (int)qVar9;
  if (lVar2 == 0) {
LAB_0044770c:
    iVar7 = -1;
  }
  else {
    lVar11 = -4;
    do {
      iVar7 = (int)in_RCX;
      lVar1 = lVar2 * -4 + lVar11;
      if (lVar1 == -4) goto LAB_00447706;
      in_RCX = lVar11 + 4;
      lVar4 = lVar11 + 4;
      lVar11 = in_RCX;
    } while (*(int *)((long)(this->indicesToActivatedChildren).d.ptr + lVar4) != index);
    iVar7 = (int)(in_RCX >> 2);
LAB_00447706:
    if (lVar1 == -4) goto LAB_0044770c;
  }
  QList<int>::move(&this->indicesToActivatedChildren,(long)iVar7,0);
  internalRaise(this,(QMdiSubWindow *)local_58);
  if (this->updatesDisabledByUs == true) {
    QWidget::setUpdatesEnabled(this_00,true);
    this->updatesDisabledByUs = false;
  }
  pQVar5 = local_58;
  if (local_58 == (QWidget *)0x0) {
    pDVar10 = (Data *)0x0;
  }
  else {
    pDVar10 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&local_58->super_QObject);
  }
  pDVar3 = (this->active).wp.d;
  (this->active).wp.d = pDVar10;
  (this->active).wp.value = &pQVar5->super_QObject;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
  }
  pDVar10 = (this->aboutToBecomeActive).wp.d;
  (this->aboutToBecomeActive).wp.d = (Data *)0x0;
  (this->aboutToBecomeActive).wp.value = (QObject *)0x0;
  if (pDVar10 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar10 = *(int *)pDVar10 + -1;
    UNLOCK();
    if (*(int *)pDVar10 == 0) {
      operator_delete(pDVar10);
    }
  }
  if (this->tabBar != (QMdiAreaTabBar *)0x0) {
    iVar7 = QTabBar::currentIndex(&this->tabBar->super_QTabBar);
    if (iVar7 != index) {
      QTabBar::setCurrentIndex(&this->tabBar->super_QTabBar,index);
    }
  }
  bVar6 = QWidget::isMaximized((QWidget *)(this->active).wp.value);
  if ((bVar6) &&
     (((this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff ||
      ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff)))) {
    updateScrollBars(this);
  }
  pDVar10 = (this->active).wp.d;
  if ((pDVar10 == (Data *)0x0) || (*(int *)(pDVar10 + 4) == 0)) {
    local_50 = (QObject *)0x0;
  }
  else {
    local_50 = (this->active).wp.value;
  }
  ppQStack_40 = &local_50;
  local_48 = (void *)0x0;
  QMetaObject::activate(&this_00->super_QObject,&QMdiArea::staticMetaObject,0,&local_48);
LAB_0044784f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::emitWindowActivated(QMdiSubWindow *activeWindow)
{
    Q_Q(QMdiArea);
    Q_ASSERT(activeWindow);
    if (activeWindow == active)
        return;
    Q_ASSERT(activeWindow->d_func()->isActive);

    if (!aboutToBecomeActive)
        _q_deactivateAllWindows(activeWindow);
    Q_ASSERT(aboutToBecomeActive);

    // This is true only if 'DontMaximizeSubWindowOnActivation' is disabled
    // and the previous active window was maximized.
    if (showActiveWindowMaximized) {
        if (!activeWindow->isMaximized())
            activeWindow->showMaximized();
        showActiveWindowMaximized = false;
    }

    // Put in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(activeWindow);
    Q_ASSERT(indexToActiveWindow != -1);
    const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
    Q_ASSERT(index != -1);
    indicesToActivatedChildren.move(index, 0);
    internalRaise(activeWindow);

    if (updatesDisabledByUs) {
        q->setUpdatesEnabled(true);
        updatesDisabledByUs = false;
    }

    Q_ASSERT(aboutToBecomeActive == activeWindow);
    active = activeWindow;
    aboutToBecomeActive = nullptr;
    Q_ASSERT(active->d_func()->isActive);

#if QT_CONFIG(tabbar)
    if (tabBar && tabBar->currentIndex() != indexToActiveWindow)
        tabBar->setCurrentIndex(indexToActiveWindow);
#endif

    if (active->isMaximized() && scrollBarsEnabled())
        updateScrollBars();

    emit q->subWindowActivated(active);
}